

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_test.cc
# Opt level: O2

void __thiscall sample_after_nomalizing_basic::test_method(sample_after_nomalizing_basic *this)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  int scode;
  uint32_t chosen_index;
  undefined4 local_17c;
  vector<float,_std::allocator<float>_> pdf;
  vector<float,_std::allocator<float>_> expected;
  undefined **local_148;
  ulong uStack_140;
  undefined8 *local_138;
  char *local_130;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_148 = (undefined **)0x400000003f800000;
  uStack_140 = 0x4080000040400000;
  local_138._0_4_ = 0x40a00000;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_148;
  std::vector<float,_std::allocator<float>_>::vector(&pdf,__l,(allocator_type *)&expected);
  local_148 = (undefined **)0x3e0888893d888889;
  uStack_140 = 0x3e8888893e4ccccd;
  local_138 = (undefined8 *)CONCAT44(local_138._4_4_,0x3eaaaaab);
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_148;
  std::vector<float,_std::allocator<float>_>::vector
            (&expected,__l_00,(allocator_type *)&chosen_index);
  scode = exploration::
          sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    (0x1e6f,pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                     pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,&chosen_index);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x13);
  uStack_140 = uStack_140 & 0xffffffffffffff00;
  local_148 = &PTR__lazy_ostream_002be780;
  local_138 = &boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
  ;
  local_58 = "";
  local_17c = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_148,&local_60,0x13,1,2,&scode,"scode",&local_17c,"0");
  check_float_vectors(&pdf,&expected,0.0001);
  scode = exploration::
          sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    (0x1e6f,pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                     pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,&chosen_index);
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x17);
  uStack_140 = uStack_140 & 0xffffffffffffff00;
  local_148 = &PTR__lazy_ostream_002be780;
  local_138 = &boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
  ;
  local_88 = "";
  local_17c = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_148,&local_90,0x17,1,2,&scode,"scode",&local_17c,"0");
  check_float_vectors(&pdf,&expected,0.0001);
  scode = exploration::
          sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    (0x1e6f,pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                     pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,&chosen_index);
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x1b);
  uStack_140 = uStack_140 & 0xffffffffffffff00;
  local_148 = &PTR__lazy_ostream_002be780;
  local_138 = &boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
  ;
  local_b8 = "";
  local_17c = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_148,&local_c0,0x1b,1,2,&scode,"scode",&local_17c,"0");
  check_float_vectors(&pdf,&expected,0.0001);
  scode = exploration::
          sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    (0x1e6f,pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                     pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,&chosen_index);
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x1f);
  uStack_140 = uStack_140 & 0xffffffffffffff00;
  local_148 = &PTR__lazy_ostream_002be780;
  local_138 = &boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
  ;
  local_e8 = "";
  local_17c = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_148,&local_f0,0x1f,1,2,&scode,"scode",&local_17c,"0");
  check_float_vectors(&pdf,&expected,0.0001);
  scode = exploration::
          sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    (0x1e6f,pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                     pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,&chosen_index);
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x23);
  uStack_140 = uStack_140 & 0xffffffffffffff00;
  local_148 = &PTR__lazy_ostream_002be780;
  local_138 = &boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
  ;
  local_118 = "";
  local_17c = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_148,&local_120,0x23,1,2,&scode,"scode",&local_17c,"0");
  check_float_vectors(&pdf,&expected,0.0001);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&expected.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&pdf.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(sample_after_nomalizing_basic) {
  std::vector<float> pdf = { 1.0f, 2.0f, 3.0f, 4.0f, 5.0f };
  const std::vector<float> expected = { 0.066666667f,	0.133333333f,	0.2f,	0.266666667f,	0.333333333f };
  uint32_t chosen_index;

  auto scode = exploration::sample_after_normalizing(7791, begin(pdf), end(pdf), chosen_index);
  BOOST_CHECK_EQUAL(scode, S_EXPLORATION_OK);
  check_float_vectors(pdf, expected, .0001f);

  scode = exploration::sample_after_normalizing(7791, begin(pdf), end(pdf), chosen_index);
  BOOST_CHECK_EQUAL(scode, S_EXPLORATION_OK);
  check_float_vectors(pdf, expected, .0001f);

  scode = exploration::sample_after_normalizing(7791, begin(pdf), end(pdf), chosen_index);
  BOOST_CHECK_EQUAL(scode, S_EXPLORATION_OK);
  check_float_vectors(pdf, expected, .0001f);

  scode = exploration::sample_after_normalizing(7791, begin(pdf), end(pdf), chosen_index);
  BOOST_CHECK_EQUAL(scode, S_EXPLORATION_OK);
  check_float_vectors(pdf, expected, .0001f);

  scode = exploration::sample_after_normalizing(7791, begin(pdf), end(pdf), chosen_index);
  BOOST_CHECK_EQUAL(scode, S_EXPLORATION_OK);
  check_float_vectors(pdf, expected, .0001f);
}